

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::UnknownFieldSetSerializer
               (uint8 *base,uint32 offset,uint32 tag,uint32 has_offset,CodedOutputStream *output)

{
  CodedOutputStream *output_00;
  uint in_ESI;
  long in_RDI;
  UnknownFieldSet *in_R8;
  InternalMetadataWithArena *metadata;
  void *ptr;
  
  output_00 = (CodedOutputStream *)(in_RDI + (ulong)in_ESI);
  if (((uint)(output_00->impl_).end_ & 1) == 1) {
    if (((uint)(output_00->impl_).end_ & 1) == 1) {
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)output_00);
    }
    else {
      InternalMetadataWithArena::default_instance();
    }
    WireFormat::SerializeUnknownFields(in_R8,output_00);
  }
  return;
}

Assistant:

void UnknownFieldSetSerializer(const uint8* base, uint32 offset, uint32 tag,
                               uint32 has_offset,
                               io::CodedOutputStream* output) {
  const void* ptr = base + offset;
  const InternalMetadataWithArena* metadata =
      static_cast<const InternalMetadataWithArena*>(ptr);
  if (metadata->have_unknown_fields()) {
    internal::WireFormat::SerializeUnknownFields(metadata->unknown_fields(),
                                                 output);
  }
}